

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

bool_t prf_object_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict9 *data;
  int pos;
  uint32_t in_stack_ffffffffffffffcc;
  uint16_t value;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RDI == prf_object_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    bf_write(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (uint)((ulong)in_RDI >> 0x20));
    bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
    value = (uint16_t)(in_stack_ffffffffffffffcc >> 0x10);
    bf_put_int16_be(bfile_00,value);
    bf_put_uint16_be(bfile_00,value);
    bf_put_int16_be(bfile_00,value);
    bf_put_int16_be(bfile_00,value);
    bf_put_int16_be(bfile_00,value);
    uVar1 = 0x1a;
    if (0x1b < in_RDI[1]) {
      bf_put_int16_be(bfile_00,value);
      uVar1 = 0x1c;
    }
    if (uVar1 < in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
  }
  else {
    prf_error(9,"tried object save method on node of type %d.",(ulong)*in_RDI);
  }
  return 0;
}

Assistant:

static
bool_t
prf_object_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_object_info.opcode ) {
        prf_error( 9, "tried object save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        bf_write( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        bf_put_int16_be( bfile, data->relative_priority ); pos += 2;
        bf_put_uint16_be( bfile, data->transparency ); pos += 2;
        bf_put_int16_be( bfile, data->special_effect_id1 ); pos += 2;
        bf_put_int16_be( bfile, data->special_effect_id2 ); pos += 2;
        bf_put_int16_be( bfile, data->significance ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->spare ); pos += 2;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return FALSE;
}